

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O3

void init_compiler(Compiler *compiler,char *source)

{
  VarHashTable ht;
  Scanner scanner;
  Token local_70;
  Scanner local_50;
  
  init_scanner(&local_50,source);
  (compiler->scanner).line = local_50.line;
  *(undefined4 *)&(compiler->scanner).field_0x34 = local_50._52_4_;
  (compiler->scanner).previous.length = local_50.previous.length;
  (compiler->scanner).previous.line = local_50.previous.line;
  *(undefined4 *)&(compiler->scanner).previous.field_0x1c = local_50.previous._28_4_;
  (compiler->scanner).previous.type = local_50.previous.type;
  *(undefined4 *)&(compiler->scanner).previous.field_0x4 = local_50.previous._4_4_;
  (compiler->scanner).previous.start = local_50.previous.start;
  (compiler->scanner).start = local_50.start;
  (compiler->scanner).current = local_50.current;
  *(undefined8 *)&compiler->previous = 0x2c;
  (compiler->previous).start = (char *)0x0;
  (compiler->previous).length = 0;
  *(undefined8 *)&(compiler->previous).line = 1;
  scan_token(&local_70,&compiler->scanner);
  (compiler->token).length = local_70.length;
  (compiler->token).line = local_70.line;
  *(undefined4 *)&(compiler->token).field_0x1c = local_70._28_4_;
  (compiler->token).type = local_70.type;
  *(undefined4 *)&(compiler->token).field_0x4 = local_70._4_4_;
  (compiler->token).start = local_70.start;
  scan_token(&local_70,&compiler->scanner);
  (compiler->next).length = local_70.length;
  (compiler->next).line = local_70.line;
  *(undefined4 *)&(compiler->next).field_0x1c = local_70._28_4_;
  (compiler->next).type = local_70.type;
  *(undefined4 *)&(compiler->next).field_0x4 = local_70._4_4_;
  (compiler->next).start = local_70.start;
  var_ht_init((VarHashTable *)&local_70,0x10);
  compiler->scope[0].cap = local_70.type;
  compiler->scope[0].size = local_70._4_4_;
  compiler->scope[0].buckets = (VarHTItem **)local_70.start;
  compiler->scope_depth = 0;
  compiler->vars_in_scope = 0;
  compiler->print_expr = false;
  return;
}

Assistant:

static void init_compiler(Compiler *compiler, const char *source) {
    Scanner scanner;
    init_scanner(&scanner, source);

    compiler->scanner = scanner;
    Token err = {TOKEN_ERROR, NULL, 0, 1};
    compiler->previous = err;
    compiler->token = scan_token(&compiler->scanner);
    compiler->next = scan_token(&compiler->scanner);

    VarHashTable ht;
    var_ht_init(&ht, 16);
    compiler->scope[0] = ht;

    compiler->scope_depth = 0;
    compiler->vars_in_scope = 0;
    compiler->print_expr = false;
}